

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<unsigned_int,_2>,_double>::call
          (unary<tcu::Vector<unsigned_int,_2>,_double> *this,GLvoid *result_dst,GLvoid *argument_src
          )

{
  double local_40;
  code *local_38;
  functionPointer p_function;
  double arg;
  Vector<unsigned_int,_2> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Vector<unsigned_int,_2>,_double> *this_local;
  
  result.m_data = (uint  [2])argument_src;
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&arg);
  unpack<double>::get((GLvoid *)result.m_data,(double *)&p_function);
  local_38 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_38)(&local_40,&p_function);
  arg = local_40;
  pack<tcu::Vector<unsigned_int,_2>_>::set(result_dst,(Vector<unsigned_int,_2> *)&arg);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}